

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_connection_state(connectdata *conn,_Bool *done)

{
  uchar *plaintext;
  smb_conn_state sVar1;
  char *pcVar2;
  long lVar3;
  CURLcode CVar4;
  size_t sVar5;
  size_t sVar6;
  void *msg;
  uchar nt_hash [21];
  uchar lm_hash [21];
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  uchar lm [24];
  _Bool ssl_done;
  undefined1 local_44b [3];
  undefined4 local_448;
  undefined2 local_444;
  sshstate local_442;
  undefined4 local_43e;
  undefined4 local_436;
  short local_432;
  uchar local_430 [8];
  uchar auStack_428 [8];
  uchar local_420 [8];
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  char local_400;
  char cStack_3ff;
  undefined4 uStack_3fe;
  undefined2 uStack_3fa;
  undefined4 uStack_3f8;
  undefined1 auStack_3f4 [30];
  char acStack_3d6 [934];
  
  msg = (void *)0x0;
  if ((conn->proto).smbc.state == SMB_CONNECTING) {
    if ((conn->handler->flags & 1) != 0) {
      _ssl_done = _ssl_done & 0xff00;
      CVar4 = Curl_ssl_connect_nonblocking(conn,0,&ssl_done);
      if ((CVar4 != CURLE_OK) && (CVar4 != CURLE_AGAIN)) {
        return CVar4;
      }
      if (ssl_done != true) {
        return CURLE_OK;
      }
    }
    CVar4 = smb_send_message(conn,'r',"",0xf);
    if (CVar4 != CURLE_OK) goto LAB_003d6b13;
    (conn->proto).smbc.state = SMB_NEGOTIATE;
  }
  CVar4 = smb_send_and_recv(conn,&msg);
  if ((CVar4 != CURLE_OK) && (CVar4 != CURLE_AGAIN)) {
LAB_003d6b13:
    Curl_conncontrol(conn,1);
    return CVar4;
  }
  if (msg == (void *)0x0) {
    return CURLE_OK;
  }
  sVar1 = (conn->proto).smbc.state;
  if (sVar1 == SMB_SETUP) {
    if (*(int *)((long)msg + 9) != 0) {
      Curl_conncontrol(conn,1);
      return CURLE_LOGIN_DENIED;
    }
    (conn->proto).smbc.uid = *(unsigned_short *)((long)msg + 0x20);
    (conn->proto).smbc.state = SMB_CONNECTED;
    *done = true;
  }
  else if (sVar1 == SMB_NEGOTIATE) {
    if ((*(int *)((long)msg + 9) != 0) || ((ulong)(conn->proto).ftpc.pp.response_time < 0x51)) {
      Curl_conncontrol(conn,1);
      return CURLE_COULDNT_CONNECT;
    }
    *(undefined8 *)&(conn->proto).ftpc.pp.pending_resp = *(undefined8 *)((long)msg + 0x49);
    (conn->proto).sshc.nextstate = *(sshstate *)((long)msg + 0x34);
    sVar5 = strlen((char *)(conn->proto).ftpc.pp.cache_size);
    sVar6 = strlen((char *)(conn->proto).ftpc.pp.nread_resp);
    if ((sVar6 + sVar5) - 0x3c4 < 0xfffffffffffffbff) {
      CVar4 = CURLE_FILESIZE_EXCEEDED;
    }
    else {
      plaintext = (conn->proto).smbc.challenge;
      Curl_ntlm_core_mk_lm_hash(conn->data,conn->passwd,lm_hash);
      Curl_ntlm_core_lm_resp(lm_hash,plaintext,lm);
      Curl_ntlm_core_mk_nt_hash(conn->data,conn->passwd,nt_hash);
      Curl_ntlm_core_lm_resp(nt_hash,plaintext,(uchar *)&local_488);
      memset(local_44b,0,0x41b);
      _ssl_done = 0xff0d;
      local_448 = 0x19000;
      local_444 = 1;
      local_442 = (conn->proto).sshc.nextstate;
      local_436 = 8;
      local_43e = 0x180018;
      local_420[0] = lm[0x10];
      local_420[1] = lm[0x11];
      local_420[2] = lm[0x12];
      local_420[3] = lm[0x13];
      local_420[4] = lm[0x14];
      local_420[5] = lm[0x15];
      local_420[6] = lm[0x16];
      local_420[7] = lm[0x17];
      local_430[0] = lm[0];
      local_430[1] = lm[1];
      local_430[2] = lm[2];
      local_430[3] = lm[3];
      local_430[4] = lm[4];
      local_430[5] = lm[5];
      local_430[6] = lm[6];
      local_430[7] = lm[7];
      auStack_428[0] = lm[8];
      auStack_428[1] = lm[9];
      auStack_428[2] = lm[10];
      auStack_428[3] = lm[0xb];
      auStack_428[4] = lm[0xc];
      auStack_428[5] = lm[0xd];
      auStack_428[6] = lm[0xe];
      auStack_428[7] = lm[0xf];
      local_408 = local_478;
      local_418 = local_488;
      uStack_410 = uStack_480;
      pcVar2 = (char *)(conn->proto).ftpc.pp.cache_size;
      strcpy(&local_400,pcVar2);
      sVar5 = strlen(pcVar2);
      pcVar2 = (char *)(conn->proto).ftpc.pp.nread_resp;
      strcpy(&cStack_3ff + sVar5,pcVar2);
      sVar6 = strlen(pcVar2);
      lVar3 = sVar6 + sVar5;
      *(undefined4 *)((long)&uStack_3fe + lVar3) = 0x756e694c;
      *(undefined2 *)((long)&uStack_3fa + lVar3) = 0x78;
      *(undefined4 *)(auStack_3f4 + lVar3 + -4) = 0x6c727563;
      auStack_3f4[lVar3] = 0;
      local_432 = (short)(&cStack_3ff + (lVar3 - (long)local_430)) + 0xc;
      CVar4 = smb_send_message(conn,'s',&ssl_done,
                               (size_t)(&cStack_3ff + (lVar3 - (long)local_430) + 0x29));
      if (CVar4 == CURLE_OK) {
        (conn->proto).smbc.state = SMB_SETUP;
        goto LAB_003d6b53;
      }
    }
    Curl_conncontrol(conn,1);
    return CVar4;
  }
LAB_003d6b53:
  (conn->proto).ftpc.pp.response_time = 0;
  return CURLE_OK;
}

Assistant:

static CURLcode smb_connection_state(struct connectdata *conn, bool *done)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_negotiate_response *nrsp;
  struct smb_header *h;
  CURLcode result;
  void *msg = NULL;

  if(smbc->state == SMB_CONNECTING) {
#ifdef USE_SSL
    if((conn->handler->flags & PROTOPT_SSL)) {
      bool ssl_done = FALSE;
      result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, &ssl_done);
      if(result && result != CURLE_AGAIN)
        return result;
      if(!ssl_done)
        return CURLE_OK;
    }
#endif

    result = smb_send_negotiate(conn);
    if(result) {
      connclose(conn, "SMB: failed to send negotiate message");
      return result;
    }

    conn_state(conn, SMB_NEGOTIATE);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(conn, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(smbc->state) {
  case SMB_NEGOTIATE:
    if(h->status || smbc->got < sizeof(*nrsp) + sizeof(smbc->challenge) - 1) {
      connclose(conn, "SMB: negotiation failed");
      return CURLE_COULDNT_CONNECT;
    }
    nrsp = msg;
    memcpy(smbc->challenge, nrsp->bytes, sizeof(smbc->challenge));
    smbc->session_key = smb_swap32(nrsp->session_key);
    result = smb_send_setup(conn);
    if(result) {
      connclose(conn, "SMB: failed to send setup message");
      return result;
    }
    conn_state(conn, SMB_SETUP);
    break;

  case SMB_SETUP:
    if(h->status) {
      connclose(conn, "SMB: authentication failed");
      return CURLE_LOGIN_DENIED;
    }
    smbc->uid = smb_swap16(h->uid);
    conn_state(conn, SMB_CONNECTED);
    *done = true;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  return CURLE_OK;
}